

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::XYZVisitor::internalVisit(XYZVisitor *this,StuntDouble *sd)

{
  long *plVar1;
  undefined1 auVar2 [8];
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long *plVar5;
  string line;
  char buffer [1024];
  value_type local_488;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  long local_460;
  undefined1 local_458 [8];
  undefined8 uStack_450;
  SnapshotManager *local_440;
  char local_438 [1032];
  
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)local_458,(string *)sd);
  p_Var4 = uStack_450;
  auVar2 = local_458;
  local_458 = (undefined1  [8])0x0;
  uStack_450._0_4_ = otAtom;
  uStack_450._4_4_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,
                    CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                             local_488.field_2._M_local_buf[0]) + 1);
  }
  if ((auVar2 == (undefined1  [8])0x0) ||
     (local_460 = __dynamic_cast(auVar2,&GenericData::typeinfo,&AtomData::typeinfo,0),
     local_460 == 0)) {
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
  }
  else {
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    plVar1 = *(long **)(local_460 + 0x28);
    if (plVar1 != *(long **)(local_460 + 0x30)) {
      local_468 = p_Var4;
      puVar3 = (undefined8 *)*plVar1;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[1];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (puVar3 != (undefined8 *)0x0) {
        local_440 = (SnapshotManager *)&this->frame;
        p_Var4 = this_00;
        do {
          plVar5 = plVar1 + 2;
          local_488._M_string_length = 0;
          local_488.field_2._M_local_buf[0] = '\0';
          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
          snprintf(local_438,0x400,"%s",*puVar3);
          std::__cxx11::string::append((char *)&local_488);
          if (this->doPositions_ == true) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)puVar3[5],puVar3[6],puVar3[7]);
            std::__cxx11::string::append((char *)&local_488);
          }
          if ((this->doCharges_ == true) && (*(char *)(puVar3 + 0x15) == '\x01')) {
            snprintf(local_438,0x400,"%15.8f",(int)puVar3[0x14]);
            std::__cxx11::string::append((char *)&local_488);
          }
          if ((this->doVectors_ == true) && (*(char *)((long)puVar3 + 0xa9) == '\x01')) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)puVar3[8],puVar3[9],puVar3[10]);
            std::__cxx11::string::append((char *)&local_488);
          }
          if ((this->doVelocities_ == true) && (*(char *)((long)puVar3 + 0xaa) == '\x01')) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)puVar3[0xb],puVar3[0xc],puVar3[0xd]);
            std::__cxx11::string::append((char *)&local_488);
          }
          if ((this->doForces_ == true) && (*(char *)((long)puVar3 + 0xab) == '\x01')) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)puVar3[0xe],puVar3[0xf],puVar3[0x10])
            ;
            std::__cxx11::string::append((char *)&local_488);
          }
          if ((this->doElectricFields_ == true) && (*(char *)((long)puVar3 + 0xac) == '\x01')) {
            snprintf(local_438,0x400,"%15.8f%15.8f%15.8f",(int)puVar3[0x11],puVar3[0x12],
                     puVar3[0x13]);
            std::__cxx11::string::append((char *)&local_488);
          }
          if (this->doGlobalIDs_ == true) {
            snprintf(local_438,0x400,"%10d",(ulong)*(uint *)(puVar3 + 4));
            std::__cxx11::string::append((char *)&local_488);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_440,&local_488);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p != &local_488.field_2) {
            operator_delete(local_488._M_dataplus._M_p,
                            CONCAT71(local_488.field_2._M_allocated_capacity._1_7_,
                                     local_488.field_2._M_local_buf[0]) + 1);
          }
          if (plVar5 == *(long **)(local_460 + 0x30)) {
            puVar3 = (undefined8 *)0x0;
LAB_0021b22d:
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            puVar3 = (undefined8 *)*plVar5;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar1[3];
            if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0021b22d;
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          }
          p_Var4 = this_00;
          plVar1 = plVar5;
        } while (puVar3 != (undefined8 *)0x0);
      }
      p_Var4 = local_468;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  return;
}

Assistant:

void XYZVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    char buffer[1024];

    // if there is not atom data, just skip it
    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      std::string line;
      snprintf(buffer, 1024, "%s", atomInfo->atomTypeName.c_str());
      line += buffer;

      if (doPositions_) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->pos[0],
                 atomInfo->pos[1], atomInfo->pos[2]);
        line += buffer;
      }
      if (doCharges_ && atomInfo->hasCharge) {
        snprintf(buffer, 1024, "%15.8f", atomInfo->charge);
        line += buffer;
      }
      if (doVectors_ && atomInfo->hasVector) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vec[0],
                 atomInfo->vec[1], atomInfo->vec[2]);
        line += buffer;
      }
      if (doVelocities_ && atomInfo->hasVelocity) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->vel[0],
                 atomInfo->vel[1], atomInfo->vel[2]);
        line += buffer;
      }
      if (doForces_ && atomInfo->hasForce) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->frc[0],
                 atomInfo->frc[1], atomInfo->frc[2]);
        line += buffer;
      }
      if (doElectricFields_ && atomInfo->hasElectricField) {
        snprintf(buffer, 1024, "%15.8f%15.8f%15.8f", atomInfo->eField[0],
                 atomInfo->eField[1], atomInfo->eField[2]);
        line += buffer;
      }
      if (doGlobalIDs_) {
        snprintf(buffer, 1024, "%10d", atomInfo->globalID);
        line += buffer;
      }

      frame.push_back(line);
    }
  }